

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const_mod.hpp
# Opt level: O0

uint boost::random::const_mod<unsigned_int,_2147483647U>::mult(uint a,uint x)

{
  unsigned_type uVar1;
  unsigned_type uVar2;
  uint in_ESI;
  uint in_EDI;
  uint unaff_retaddr;
  uint in_stack_fffffffffffffffc;
  
  uVar1 = unsigned_m();
  uVar2 = unsigned_m();
  if ((uVar1 - 1 & uVar2) == 0) {
    uVar1 = unsigned_m();
    in_ESI = in_EDI * in_ESI & uVar1 - 1;
  }
  else if (in_EDI == 0) {
    in_ESI = 0;
  }
  else if (in_EDI != 1) {
    if ((uint)(0xffffffff / (ulong)in_EDI) < 0x7fffffff) {
      in_ESI = mult_general(unaff_retaddr,in_stack_fffffffffffffffc);
    }
    else {
      in_ESI = mult_small(in_EDI,in_ESI);
    }
  }
  return in_ESI;
}

Assistant:

static IntType mult(IntType a, IntType x)
  {
    if(((unsigned_m() - 1) & unsigned_m()) == 0)
      return unsigned_type(a) * unsigned_type(x) & (unsigned_m() - 1);
    else if(a == 0)
      return 0;
    else if(a == 1)
      return x;
    else if(m <= traits::const_max/a)      // i.e. a*m <= max
      return mult_small(a, x);
    else if(traits::is_signed && (m%a < m/a))
      return mult_schrage(a, x);
    else
      return mult_general(a, x);
  }